

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_state_use_port(connectdata *conn,ftpport fcmd)

{
  char cVar1;
  unsigned_short uVar2;
  int iVar3;
  CURLcode CVar4;
  uint uVar5;
  if2ip_result_t iVar6;
  size_t sVar7;
  char *pcVar8;
  char *__s;
  char *pcVar9;
  ulong uVar10;
  undefined6 extraout_var;
  int *piVar11;
  long lVar12;
  ftpport fVar13;
  Curl_addrinfo *ai;
  char cVar14;
  size_t sVar15;
  SessionHandle *pSVar16;
  ushort uVar17;
  uint uVar18;
  ushort uVar19;
  int iVar20;
  curl_socket_t portsock;
  SessionHandle *local_9e0;
  curl_socklen_t sslen;
  uint local_9d4;
  ftpport local_9d0;
  undefined4 local_9cc;
  pingpong *local_9c8;
  Curl_dns_entry *h;
  Curl_sockaddr_storage ss;
  char myhost [256];
  char tmp [1024];
  char hbuf [1025];
  
  pSVar16 = conn->data;
  portsock = -1;
  memset(myhost,0,0x100);
  pcVar9 = (pSVar16->set).str[9];
  h = (Curl_dns_entry *)0x0;
  local_9e0 = pSVar16;
  local_9d0 = fcmd;
  if ((pcVar9 == (char *)0x0) || (sVar7 = strlen(pcVar9), sVar7 < 2)) {
    pcVar8 = (char *)0x0;
    uVar17 = 0;
    pSVar16 = local_9e0;
    uVar5 = 0;
  }
  else {
    sVar15 = 0x11;
    if (0xf < sVar7) {
      sVar15 = sVar7 + 1;
    }
    pcVar8 = (char *)(*Curl_ccalloc)(sVar15,1);
    if (pcVar8 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    __s = pcVar9;
    if (*pcVar9 == ':') {
LAB_00463fc4:
      pcVar9 = strchr(__s,0x3a);
      if (pcVar9 == (char *)0x0) goto LAB_00464298;
      uVar10 = strtoul(pcVar9 + 1,(char **)0x0,10);
      uVar2 = curlx_ultous(uVar10);
      uVar5 = (uint)CONCAT62(extraout_var,uVar2);
      pcVar9 = strchr(pcVar9,0x2d);
      pSVar16 = local_9e0;
      uVar18 = uVar5;
      if (pcVar9 != (char *)0x0) {
        uVar10 = strtoul(pcVar9 + 1,(char **)0x0,10);
        uVar2 = curlx_ultous(uVar10);
        uVar18 = (uint)uVar2;
      }
    }
    else {
      __s = strchr(pcVar9,0x3a);
      if (__s != (char *)0x0) {
        strncpy(pcVar8,pcVar9,(long)__s - (long)pcVar9);
        goto LAB_00463fc4;
      }
      strcpy(pcVar8,pcVar9);
LAB_00464298:
      uVar5 = 0;
      pSVar16 = local_9e0;
      uVar18 = 0;
    }
    uVar17 = (ushort)uVar18;
    if (uVar17 < (ushort)uVar5) {
      uVar5 = 0;
      uVar17 = 0;
    }
    if (*pcVar8 != '\0') {
      iVar3 = conn->ip_addr->ai_family;
      local_9d4 = uVar5;
      uVar5 = Curl_ipv6_scope(conn->ip_addr->ai_addr);
      pcVar9 = pcVar8;
      iVar6 = Curl_if2ip(iVar3,uVar5,conn->scope_id,pcVar8,hbuf,0x401);
      local_9cc = (undefined4)CONCAT71((int7)((ulong)pcVar9 >> 8),1);
      pcVar9 = pcVar8;
      if (iVar6 == IF2IP_NOT_FOUND) goto LAB_004640c7;
      if (iVar6 == IF2IP_AF_NOT_SUPPORTED) {
        return CURLE_FTP_PORT_FAILED;
      }
      pcVar9 = hbuf;
      uVar5 = local_9d4;
      if (iVar6 == IF2IP_FOUND) goto LAB_004640c7;
    }
  }
  sslen = 0x80;
  iVar3 = getsockname(conn->sock[0],(sockaddr *)&ss,&sslen);
  if (iVar3 != 0) {
    piVar11 = __errno_location();
    pcVar9 = Curl_strerror(conn,*piVar11);
    Curl_failf(pSVar16,"getsockname() failed: %s",pcVar9);
    (*Curl_cfree)(pcVar8);
    return CURLE_FTP_PORT_FAILED;
  }
  local_9d4 = uVar5;
  Curl_inet_ntop((uint)ss.buffer.sa.sa_family,(void *)((long)&ss.buffer + 4),hbuf,0x401);
  local_9cc = 0;
  pcVar9 = hbuf;
LAB_004640c7:
  Curl_resolv(conn,pcVar9,0,&h);
  if (h != (Curl_dns_entry *)0x0) {
    ai = h->addr;
    Curl_resolv_unlock(pSVar16,h);
    if (ai != (Curl_addrinfo *)0x0) {
      local_9c8 = (pingpong *)&conn->proto;
      (*Curl_cfree)(pcVar8);
      uVar5 = local_9d4;
      portsock = -1;
      iVar3 = 0;
      while( true ) {
        if (ai == (Curl_addrinfo *)0x0) {
          pcVar9 = Curl_strerror(conn,iVar3);
          Curl_failf(pSVar16,"socket failure: %s",pcVar9);
          return CURLE_FTP_PORT_FAILED;
        }
        CVar4 = Curl_socket(conn,ai,(Curl_sockaddr_ex *)0x0,&portsock);
        if (CVar4 == CURLE_OK) break;
        piVar11 = __errno_location();
        iVar3 = *piVar11;
        ai = ai->ai_next;
      }
      memcpy(&ss,ai->ai_addr,(ulong)ai->ai_addrlen);
      sslen = ai->ai_addrlen;
      while( true ) {
        uVar19 = (ushort)uVar5;
        if (uVar17 < uVar19) {
          Curl_failf(local_9e0,"bind() failed, we ran out of ports!");
          goto LAB_004643cd;
        }
        if (ss.buffer.sa.sa_family == 2) {
          ss.buffer.sa_in.sin_port = uVar19 << 8 | uVar19 >> 8;
        }
        iVar3 = bind(portsock,(sockaddr *)&ss,sslen);
        if (iVar3 == 0) break;
        piVar11 = __errno_location();
        iVar3 = *piVar11;
        if ((iVar3 == 99 & (byte)local_9cc) == 1) {
          pcVar9 = Curl_strerror(conn,99);
          pSVar16 = local_9e0;
          local_9cc = 0;
          Curl_infof(local_9e0,"bind(port=%hu) on non-local address failed: %s\n",
                     (ulong)uVar5 & 0xffff,pcVar9);
          sslen = 0x80;
          iVar3 = getsockname(conn->sock[0],(sockaddr *)&ss,&sslen);
          uVar5 = local_9d4;
          if (iVar3 != 0) {
            pcVar9 = Curl_strerror(conn,*piVar11);
            pcVar8 = "getsockname() failed: %s";
LAB_004643c3:
            Curl_failf(pSVar16,pcVar8,pcVar9);
LAB_004643cd:
            Curl_closesocket(conn,portsock);
            return CURLE_FTP_PORT_FAILED;
          }
        }
        else {
          if ((iVar3 != 0xd) && (iVar3 != 0x62)) {
            pcVar9 = Curl_strerror(conn,iVar3);
            Curl_failf(local_9e0,"bind(port=%hu) failed: %s",(ulong)uVar5 & 0xffff,pcVar9);
            goto LAB_004643cd;
          }
          uVar5 = uVar5 + 1;
        }
      }
      sslen = 0x80;
      iVar3 = getsockname(portsock,(sockaddr *)&ss,&sslen);
      if (iVar3 != 0) {
        piVar11 = __errno_location();
        pcVar9 = Curl_strerror(conn,*piVar11);
        pcVar8 = "getsockname() failed: %s";
        pSVar16 = local_9e0;
        goto LAB_004643c3;
      }
      iVar20 = 1;
      iVar3 = listen(portsock,1);
      if (iVar3 != 0) {
        piVar11 = __errno_location();
        pcVar9 = Curl_strerror(conn,*piVar11);
        pcVar8 = "socket failure: %s";
        pSVar16 = local_9e0;
        goto LAB_004643c3;
      }
      Curl_printable_address(ai,myhost,0x100);
      fVar13 = local_9d0;
      do {
        if (fVar13 == DONE) {
          iVar20 = 2;
LAB_0046443d:
          (conn->proto).ftpc.count1 = iVar20;
          if (conn->sock[1] != -1) {
            Curl_closesocket(conn,conn->sock[1]);
          }
          conn->sock[1] = portsock;
          (conn->bits).tcpconnect[1] = true;
          (conn->proto).ftpc.state = FTP_PORT;
          return CURLE_OK;
        }
        if (((fVar13 != EPRT) || ((conn->bits).ftp_use_eprt != false)) &&
           (ss.buffer.sa.sa_family == 2)) {
          if (fVar13 == EPRT) {
            iVar20 = 0;
            CVar4 = Curl_pp_sendf(local_9c8,"%s |%d|%s|%hu|",ftp_state_use_port::mode,1,myhost,
                                  (ulong)(ushort)(ss.buffer.sa_in.sin_port << 8 |
                                                 ss.buffer.sa_in.sin_port >> 8));
            if (CVar4 == CURLE_OK) goto LAB_0046443d;
            pcVar9 = curl_easy_strerror(CVar4);
            Curl_failf(local_9e0,"Failure sending EPRT command: %s",pcVar9);
            Curl_closesocket(conn,portsock);
            (conn->proto).ftpc.count1 = 1;
            goto LAB_00464598;
          }
          if (fVar13 == PORT) {
            lVar12 = 0;
            while( true ) {
              cVar1 = myhost[lVar12];
              cVar14 = ',';
              if ((cVar1 != '.') && (cVar14 = cVar1, cVar1 == '\0')) break;
              tmp[lVar12] = cVar14;
              lVar12 = lVar12 + 1;
            }
            tmp[lVar12] = '\0';
            curl_msnprintf(tmp + lVar12,0x14,",%d,%d",(ulong)(ss.buffer.sa_in.sin_port & 0xff),
                           (ulong)(byte)((ushort)ss.buffer._2_2_ >> 8));
            CVar4 = Curl_pp_sendf(local_9c8,"%s %s",0x4c6c25,tmp);
            if (CVar4 == CURLE_OK) goto LAB_0046443d;
            pcVar9 = curl_easy_strerror(CVar4);
            Curl_failf(local_9e0,"Failure sending PORT command: %s",pcVar9);
            Curl_closesocket(conn,portsock);
LAB_00464598:
            (conn->proto).ftpc.state = FTP_STOP;
            return CVar4;
          }
        }
        fVar13 = fVar13 + PORT;
      } while( true );
    }
  }
  Curl_failf(pSVar16,"failed to resolve the address provided to PORT: %s",pcVar9);
  (*Curl_cfree)(pcVar8);
  return CURLE_FTP_PORT_FAILED;
}

Assistant:

static CURLcode ftp_state_use_port(struct connectdata *conn,
                                   ftpport fcmd) /* start with this */

{
  CURLcode result = CURLE_OK;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct SessionHandle *data=conn->data;
  curl_socket_t portsock= CURL_SOCKET_BAD;
  char myhost[256] = "";

  struct Curl_sockaddr_storage ss;
  Curl_addrinfo *res, *ai;
  curl_socklen_t sslen;
  char hbuf[NI_MAXHOST];
  struct sockaddr *sa=(struct sockaddr *)&ss;
  struct sockaddr_in * const sa4 = (void *)sa;
#ifdef ENABLE_IPV6
  struct sockaddr_in6 * const sa6 = (void *)sa;
#endif
  char tmp[1024];
  static const char mode[][5] = { "EPRT", "PORT" };
  int rc;
  int error;
  char *host = NULL;
  char *string_ftpport = data->set.str[STRING_FTPPORT];
  struct Curl_dns_entry *h=NULL;
  unsigned short port_min = 0;
  unsigned short port_max = 0;
  unsigned short port;
  bool possibly_non_local = TRUE;

  char *addr = NULL;

  /* Step 1, figure out what is requested,
   * accepted format :
   * (ipv4|ipv6|domain|interface)?(:port(-range)?)?
   */

  if(data->set.str[STRING_FTPPORT] &&
     (strlen(data->set.str[STRING_FTPPORT]) > 1)) {

#ifdef ENABLE_IPV6
    size_t addrlen = INET6_ADDRSTRLEN > strlen(string_ftpport) ?
      INET6_ADDRSTRLEN : strlen(string_ftpport);
#else
    size_t addrlen = INET_ADDRSTRLEN > strlen(string_ftpport) ?
      INET_ADDRSTRLEN : strlen(string_ftpport);
#endif
    char *ip_start = string_ftpport;
    char *ip_end = NULL;
    char *port_start = NULL;
    char *port_sep = NULL;

    addr = calloc(addrlen+1, 1);
    if(!addr)
      return CURLE_OUT_OF_MEMORY;

#ifdef ENABLE_IPV6
    if(*string_ftpport == '[') {
      /* [ipv6]:port(-range) */
      ip_start = string_ftpport + 1;
      if((ip_end = strchr(string_ftpport, ']')) != NULL )
        strncpy(addr, ip_start, ip_end - ip_start);
    }
    else
#endif
      if(*string_ftpport == ':') {
        /* :port */
        ip_end = string_ftpport;
    }
    else if((ip_end = strchr(string_ftpport, ':')) != NULL) {
        /* either ipv6 or (ipv4|domain|interface):port(-range) */
#ifdef ENABLE_IPV6
      if(Curl_inet_pton(AF_INET6, string_ftpport, sa6) == 1) {
        /* ipv6 */
        port_min = port_max = 0;
        strcpy(addr, string_ftpport);
        ip_end = NULL; /* this got no port ! */
      }
      else
#endif
        /* (ipv4|domain|interface):port(-range) */
        strncpy(addr, string_ftpport, ip_end - ip_start );
    }
    else
      /* ipv4|interface */
      strcpy(addr, string_ftpport);

    /* parse the port */
    if(ip_end != NULL) {
      if((port_start = strchr(ip_end, ':')) != NULL) {
        port_min = curlx_ultous(strtoul(port_start+1, NULL, 10));
        if((port_sep = strchr(port_start, '-')) != NULL) {
          port_max = curlx_ultous(strtoul(port_sep + 1, NULL, 10));
        }
        else
          port_max = port_min;
      }
    }

    /* correct errors like:
     *  :1234-1230
     *  :-4711 , in this case port_min is (unsigned)-1,
     *           therefore port_min > port_max for all cases
     *           but port_max = (unsigned)-1
     */
    if(port_min > port_max )
      port_min = port_max = 0;


    if(*addr != '\0') {
      /* attempt to get the address of the given interface name */
      switch(Curl_if2ip(conn->ip_addr->ai_family,
                        Curl_ipv6_scope(conn->ip_addr->ai_addr),
                        conn->scope_id, addr, hbuf, sizeof(hbuf))) {
        case IF2IP_NOT_FOUND:
          /* not an interface, use the given string as host name instead */
          host = addr;
          break;
        case IF2IP_AF_NOT_SUPPORTED:
          return CURLE_FTP_PORT_FAILED;
        case IF2IP_FOUND:
          host = hbuf; /* use the hbuf for host name */
      }
    }
    else
      /* there was only a port(-range) given, default the host */
      host = NULL;
  } /* data->set.ftpport */

  if(!host) {
    /* not an interface and not a host name, get default by extracting
       the IP from the control connection */

    sslen = sizeof(ss);
    if(getsockname(conn->sock[FIRSTSOCKET], sa, &sslen)) {
      failf(data, "getsockname() failed: %s",
          Curl_strerror(conn, SOCKERRNO) );
      free(addr);
      return CURLE_FTP_PORT_FAILED;
    }
    switch(sa->sa_family) {
#ifdef ENABLE_IPV6
    case AF_INET6:
      Curl_inet_ntop(sa->sa_family, &sa6->sin6_addr, hbuf, sizeof(hbuf));
      break;
#endif
    default:
      Curl_inet_ntop(sa->sa_family, &sa4->sin_addr, hbuf, sizeof(hbuf));
      break;
    }
    host = hbuf; /* use this host name */
    possibly_non_local = FALSE; /* we know it is local now */
  }

  /* resolv ip/host to ip */
  rc = Curl_resolv(conn, host, 0, &h);
  if(rc == CURLRESOLV_PENDING)
    (void)Curl_resolver_wait_resolv(conn, &h);
  if(h) {
    res = h->addr;
    /* when we return from this function, we can forget about this entry
       to we can unlock it now already */
    Curl_resolv_unlock(data, h);
  } /* (h) */
  else
    res = NULL; /* failure! */

  if(res == NULL) {
    failf(data, "failed to resolve the address provided to PORT: %s", host);
    free(addr);
    return CURLE_FTP_PORT_FAILED;
  }

  free(addr);
  host = NULL;

  /* step 2, create a socket for the requested address */

  portsock = CURL_SOCKET_BAD;
  error = 0;
  for(ai = res; ai; ai = ai->ai_next) {
    result = Curl_socket(conn, ai, NULL, &portsock);
    if(result) {
      error = SOCKERRNO;
      continue;
    }
    break;
  }
  if(!ai) {
    failf(data, "socket failure: %s", Curl_strerror(conn, error));
    return CURLE_FTP_PORT_FAILED;
  }

  /* step 3, bind to a suitable local address */

  memcpy(sa, ai->ai_addr, ai->ai_addrlen);
  sslen = ai->ai_addrlen;

  for(port = port_min; port <= port_max;) {
    if(sa->sa_family == AF_INET)
      sa4->sin_port = htons(port);
#ifdef ENABLE_IPV6
    else
      sa6->sin6_port = htons(port);
#endif
    /* Try binding the given address. */
    if(bind(portsock, sa, sslen) ) {
      /* It failed. */
      error = SOCKERRNO;
      if(possibly_non_local && (error == EADDRNOTAVAIL)) {
        /* The requested bind address is not local.  Use the address used for
         * the control connection instead and restart the port loop
         */

        infof(data, "bind(port=%hu) on non-local address failed: %s\n", port,
              Curl_strerror(conn, error) );

        sslen = sizeof(ss);
        if(getsockname(conn->sock[FIRSTSOCKET], sa, &sslen)) {
          failf(data, "getsockname() failed: %s",
                Curl_strerror(conn, SOCKERRNO) );
          Curl_closesocket(conn, portsock);
          return CURLE_FTP_PORT_FAILED;
        }
        port = port_min;
        possibly_non_local = FALSE; /* don't try this again */
        continue;
      }
      else if(error != EADDRINUSE && error != EACCES) {
        failf(data, "bind(port=%hu) failed: %s", port,
              Curl_strerror(conn, error) );
        Curl_closesocket(conn, portsock);
        return CURLE_FTP_PORT_FAILED;
      }
    }
    else
      break;

    port++;
  }

  /* maybe all ports were in use already*/
  if(port > port_max) {
    failf(data, "bind() failed, we ran out of ports!");
    Curl_closesocket(conn, portsock);
    return CURLE_FTP_PORT_FAILED;
  }

  /* get the name again after the bind() so that we can extract the
     port number it uses now */
  sslen = sizeof(ss);
  if(getsockname(portsock, (struct sockaddr *)sa, &sslen)) {
    failf(data, "getsockname() failed: %s",
          Curl_strerror(conn, SOCKERRNO) );
    Curl_closesocket(conn, portsock);
    return CURLE_FTP_PORT_FAILED;
  }

  /* step 4, listen on the socket */

  if(listen(portsock, 1)) {
    failf(data, "socket failure: %s", Curl_strerror(conn, SOCKERRNO));
    Curl_closesocket(conn, portsock);
    return CURLE_FTP_PORT_FAILED;
  }

  /* step 5, send the proper FTP command */

  /* get a plain printable version of the numerical address to work with
     below */
  Curl_printable_address(ai, myhost, sizeof(myhost));

#ifdef ENABLE_IPV6
  if(!conn->bits.ftp_use_eprt && conn->bits.ipv6)
    /* EPRT is disabled but we are connected to a IPv6 host, so we ignore the
       request and enable EPRT again! */
    conn->bits.ftp_use_eprt = TRUE;
#endif

  for(; fcmd != DONE; fcmd++) {

    if(!conn->bits.ftp_use_eprt && (EPRT == fcmd))
      /* if disabled, goto next */
      continue;

    if((PORT == fcmd) && sa->sa_family != AF_INET)
      /* PORT is IPv4 only */
      continue;

    switch(sa->sa_family) {
    case AF_INET:
      port = ntohs(sa4->sin_port);
      break;
#ifdef ENABLE_IPV6
    case AF_INET6:
      port = ntohs(sa6->sin6_port);
      break;
#endif
    default:
      continue; /* might as well skip this */
    }

    if(EPRT == fcmd) {
      /*
       * Two fine examples from RFC2428;
       *
       * EPRT |1|132.235.1.2|6275|
       *
       * EPRT |2|1080::8:800:200C:417A|5282|
       */

      result = Curl_pp_sendf(&ftpc->pp, "%s |%d|%s|%hu|", mode[fcmd],
                             sa->sa_family == AF_INET?1:2,
                             myhost, port);
      if(result) {
        failf(data, "Failure sending EPRT command: %s",
              curl_easy_strerror(result));
        Curl_closesocket(conn, portsock);
        /* don't retry using PORT */
        ftpc->count1 = PORT;
        /* bail out */
        state(conn, FTP_STOP);
        return result;
      }
      break;
    }
    else if(PORT == fcmd) {
      char *source = myhost;
      char *dest = tmp;

      /* translate x.x.x.x to x,x,x,x */
      while(source && *source) {
        if(*source == '.')
          *dest=',';
        else
          *dest = *source;
        dest++;
        source++;
      }
      *dest = 0;
      snprintf(dest, 20, ",%d,%d", (int)(port>>8), (int)(port&0xff));

      result = Curl_pp_sendf(&ftpc->pp, "%s %s", mode[fcmd], tmp);
      if(result) {
        failf(data, "Failure sending PORT command: %s",
              curl_easy_strerror(result));
        Curl_closesocket(conn, portsock);
        /* bail out */
        state(conn, FTP_STOP);
        return result;
      }
      break;
    }
  }

  /* store which command was sent */
  ftpc->count1 = fcmd;

  /* we set the secondary socket variable to this for now, it is only so that
     the cleanup function will close it in case we fail before the true
     secondary stuff is made */
  if(CURL_SOCKET_BAD != conn->sock[SECONDARYSOCKET])
    Curl_closesocket(conn, conn->sock[SECONDARYSOCKET]);
  conn->sock[SECONDARYSOCKET] = portsock;

  /* this tcpconnect assignment below is a hackish work-around to make the
     multi interface with active FTP work - as it will not wait for a
     (passive) connect in Curl_is_connected().

     The *proper* fix is to make sure that the active connection from the
     server is done in a non-blocking way. Currently, it is still BLOCKING.
  */
  conn->bits.tcpconnect[SECONDARYSOCKET] = TRUE;

  state(conn, FTP_PORT);
  return result;
}